

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O2

bool __thiscall
FIX::ThreadedSocketConnection::setSession(ThreadedSocketConnection *this,string *msg)

{
  Log *pLVar1;
  Session *pSVar2;
  iterator iVar3;
  int iVar4;
  bool bVar5;
  SessionID sessionID;
  
  pSVar2 = Session::lookupSession(msg,true);
  this->m_pSession = pSVar2;
  if (pSVar2 == (Session *)0x0) {
    pLVar1 = this->m_pLog;
    if (pLVar1 != (Log *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sessionID
                     ,"Session not found for incoming message: ",msg);
      (*pLVar1->_vptr_Log[6])(pLVar1,&sessionID);
      std::__cxx11::string::~string((string *)&sessionID);
      (*this->m_pLog->_vptr_Log[4])(this->m_pLog,msg);
    }
    return false;
  }
  SessionID::SessionID(&sessionID,&pSVar2->m_sessionID);
  this->m_pSession = (Session *)0x0;
  iVar4 = 5;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    bVar5 = Session::isSessionRegistered(&sessionID);
    if (bVar5) {
      pSVar2 = this->m_pSession;
    }
    else {
      pSVar2 = Session::registerSession(&sessionID);
      this->m_pSession = pSVar2;
    }
    if (pSVar2 != (Session *)0x0) goto LAB_001b82a5;
    process_sleep(1.0);
  }
  pSVar2 = this->m_pSession;
  if (pSVar2 != (Session *)0x0) {
LAB_001b82a5:
    iVar3 = std::
            _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
            ::find(&(this->m_sessions)._M_t,&pSVar2->m_sessionID);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header)
    {
      bVar5 = true;
      Session::setResponder(this->m_pSession,&this->super_Responder);
      goto LAB_001b82da;
    }
  }
  bVar5 = false;
LAB_001b82da:
  SessionID::~SessionID(&sessionID);
  return bVar5;
}

Assistant:

bool ThreadedSocketConnection::setSession( const std::string& msg )
{
  m_pSession = Session::lookupSession( msg, true );
  if ( !m_pSession ) 
  {
    if( m_pLog )
    {
      m_pLog->onEvent( "Session not found for incoming message: " + msg );
      m_pLog->onIncoming( msg );
    }
    return false;
  }

  SessionID sessionID = m_pSession->getSessionID();
  m_pSession = 0;

  // see if the session frees up within 5 seconds
  for( int i = 1; i <= 5; i++ )
  {
    if( !Session::isSessionRegistered( sessionID ) )
      m_pSession = Session::registerSession( sessionID );
    if( m_pSession ) break;
    process_sleep( 1 );
  }

  if ( !m_pSession ) 
    return false;
  if ( m_sessions.find(m_pSession->getSessionID()) == m_sessions.end() )
    return false;

  m_pSession->setResponder( this );
  return true;
}